

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_dp_match(char *string,char *pattern,size_t pos,size_t max)

{
  HTS_Boolean HVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  HTS_Boolean local_1;
  
  if (in_RCX < in_RDX) {
    local_1 = '\0';
  }
  else if ((*in_RDI == '\0') && (*in_RSI == '\0')) {
    local_1 = '\x01';
  }
  else if (*in_RSI == '*') {
    HVar1 = HTS_dp_match(in_RSI,in_RDX,(size_t)in_RCX,0x19969d);
    if (HVar1 == '\x01') {
      local_1 = '\x01';
    }
    else {
      local_1 = HTS_dp_match(in_RSI,in_RDX,(size_t)in_RCX,0x1996cb);
    }
  }
  else if (((*in_RDI == *in_RSI) || (*in_RSI == '?')) &&
          (HVar1 = HTS_dp_match(in_RSI,in_RDX,(size_t)in_RCX,0x19971a), HVar1 == '\x01')) {
    local_1 = '\x01';
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_dp_match(const char *string, const char *pattern, size_t pos, size_t max)
{
   if (pos > max)
      return FALSE;
   if (string[0] == '\0' && pattern[0] == '\0')
      return TRUE;
   if (pattern[0] == '*') {
      if (HTS_dp_match(string + 1, pattern, pos + 1, max) == 1)
         return TRUE;
      else
         return HTS_dp_match(string, pattern + 1, pos, max);
   }
   if (string[0] == pattern[0] || pattern[0] == '?') {
      if (HTS_dp_match(string + 1, pattern + 1, pos + 1, max + 1) == 1)
         return TRUE;
   }

   return FALSE;
}